

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong helper_popcntw(target_ulong val)

{
  ulong uVar1;
  target_ulong val_local;
  
  uVar1 = (val & 0x5555555555555555) + (val >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  uVar1 = (uVar1 & 0xf0f0f0f0f0f0f0f) + (uVar1 >> 4 & 0xf0f0f0f0f0f0f0f);
  uVar1 = (uVar1 & 0xff00ff00ff00ff) + (uVar1 >> 8 & 0xff00ff00ff00ff);
  return (uVar1 & 0xffff0000ffff) + (uVar1 >> 0x10 & 0xffff0000ffff);
}

Assistant:

target_ulong helper_popcntw(target_ulong val)
{
    /* Note that we don't fold past words.  */
    val = (val & 0x5555555555555555ULL) + ((val >>  1) &
                                           0x5555555555555555ULL);
    val = (val & 0x3333333333333333ULL) + ((val >>  2) &
                                           0x3333333333333333ULL);
    val = (val & 0x0f0f0f0f0f0f0f0fULL) + ((val >>  4) &
                                           0x0f0f0f0f0f0f0f0fULL);
    val = (val & 0x00ff00ff00ff00ffULL) + ((val >>  8) &
                                           0x00ff00ff00ff00ffULL);
    val = (val & 0x0000ffff0000ffffULL) + ((val >> 16) &
                                           0x0000ffff0000ffffULL);
    return val;
}